

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean encode_mcu_huff(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  boolean bVar5;
  long in_RSI;
  long in_RDI;
  jpeg_component_info *compptr;
  int ci;
  int blkn;
  working_state state;
  huff_entropy_ptr entropy;
  c_derived_tbl *in_stack_000001b8;
  c_derived_tbl *in_stack_000001c0;
  undefined4 in_stack_000001c8;
  int in_stack_000001cc;
  c_derived_tbl *in_stack_000001d0;
  undefined4 in_stack_000001d8;
  int in_stack_000001dc;
  JCOEFPTR in_stack_000001e0;
  working_state *in_stack_000001e8;
  working_state *in_stack_ffffffffffffff88;
  int local_64;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined4 local_28;
  long local_20;
  long local_18;
  long local_10;
  boolean local_4;
  
  local_20 = *(long *)(in_RDI + 0x1f0);
  uVar2 = **(undefined8 **)(in_RDI + 0x28);
  uVar3 = *(undefined8 *)(*(long *)(in_RDI + 0x28) + 8);
  uVar4 = *(undefined8 *)(local_20 + 0x18);
  local_48 = *(undefined8 *)(local_20 + 0x20);
  local_40 = *(undefined8 *)(local_20 + 0x28);
  local_38 = *(undefined8 *)(local_20 + 0x30);
  local_28 = *(undefined4 *)(local_20 + 0xc0);
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (((*(int *)(in_RDI + 0x118) == 0) || (*(int *)(local_20 + 0x38) != 0)) ||
     (bVar5 = emit_restart(in_stack_ffffffffffffff88,0), bVar5 != 0)) {
    if (*(int *)(local_20 + 0xc0) == 0) {
      for (local_64 = 0; local_64 < *(int *)(local_10 + 0x170); local_64 = local_64 + 1) {
        iVar1 = *(int *)(local_10 + 0x174 + (long)local_64 * 4);
        bVar5 = encode_one_block(in_stack_000001e8,in_stack_000001e0,in_stack_000001dc,
                                 in_stack_000001d0,
                                 (c_derived_tbl *)CONCAT44(in_stack_000001cc,in_stack_000001c8));
        if (bVar5 == 0) {
          return 0;
        }
        *(int *)((long)&local_48 + (long)iVar1 * 4 + 4) =
             (int)**(short **)(local_18 + (long)local_64 * 8);
      }
    }
    else {
      for (local_64 = 0; local_64 < *(int *)(local_10 + 0x170); local_64 = local_64 + 1) {
        iVar1 = *(int *)(local_10 + 0x174 + (long)local_64 * 4);
        bVar5 = encode_one_block_simd
                          ((working_state *)CONCAT44(in_stack_000001dc,in_stack_000001d8),
                           (JCOEFPTR)in_stack_000001d0,in_stack_000001cc,in_stack_000001c0,
                           in_stack_000001b8);
        if (bVar5 == 0) {
          return 0;
        }
        *(int *)((long)&local_48 + (long)iVar1 * 4 + 4) =
             (int)**(short **)(local_18 + (long)local_64 * 8);
      }
    }
    **(undefined8 **)(local_10 + 0x28) = uVar2;
    *(undefined8 *)(*(long *)(local_10 + 0x28) + 8) = uVar3;
    *(undefined8 *)(local_20 + 0x18) = uVar4;
    *(undefined8 *)(local_20 + 0x20) = local_48;
    *(undefined8 *)(local_20 + 0x28) = local_40;
    *(undefined8 *)(local_20 + 0x30) = local_38;
    if (*(int *)(local_10 + 0x118) != 0) {
      if (*(int *)(local_20 + 0x38) == 0) {
        *(undefined4 *)(local_20 + 0x38) = *(undefined4 *)(local_10 + 0x118);
        *(int *)(local_20 + 0x3c) = *(int *)(local_20 + 0x3c) + 1;
        *(uint *)(local_20 + 0x3c) = *(uint *)(local_20 + 0x3c) & 7;
      }
      *(int *)(local_20 + 0x38) = *(int *)(local_20 + 0x38) + -1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

METHODDEF(boolean)
encode_mcu_huff(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr)cinfo->entropy;
  working_state state;
  int blkn, ci;
  jpeg_component_info *compptr;

  /* Load up working state */
  state.next_output_byte = cinfo->dest->next_output_byte;
  state.free_in_buffer = cinfo->dest->free_in_buffer;
  state.cur = entropy->saved;
  state.cinfo = cinfo;
  state.simd = entropy->simd;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (!emit_restart(&state, entropy->next_restart_num))
        return FALSE;
  }

  /* Encode the MCU data blocks */
  if (entropy->simd) {
    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      ci = cinfo->MCU_membership[blkn];
      compptr = cinfo->cur_comp_info[ci];
      if (!encode_one_block_simd(&state,
                                 MCU_data[blkn][0], state.cur.last_dc_val[ci],
                                 entropy->dc_derived_tbls[compptr->dc_tbl_no],
                                 entropy->ac_derived_tbls[compptr->ac_tbl_no]))
        return FALSE;
      /* Update last_dc_val */
      state.cur.last_dc_val[ci] = MCU_data[blkn][0][0];
    }
  } else {
    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      ci = cinfo->MCU_membership[blkn];
      compptr = cinfo->cur_comp_info[ci];
      if (!encode_one_block(&state,
                            MCU_data[blkn][0], state.cur.last_dc_val[ci],
                            entropy->dc_derived_tbls[compptr->dc_tbl_no],
                            entropy->ac_derived_tbls[compptr->ac_tbl_no]))
        return FALSE;
      /* Update last_dc_val */
      state.cur.last_dc_val[ci] = MCU_data[blkn][0][0];
    }
  }

  /* Completed MCU, so update state */
  cinfo->dest->next_output_byte = state.next_output_byte;
  cinfo->dest->free_in_buffer = state.free_in_buffer;
  entropy->saved = state.cur;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}